

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_deserialize.c
# Opt level: O2

int metacall_serial_impl_deserialize_float(value *v,char *src,size_t length)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ushort **ppuVar5;
  value pvVar6;
  size_t sVar7;
  double dVar8;
  
  sVar7 = 0;
  bVar2 = false;
  do {
    if (length == sVar7) {
      dVar8 = atof(src);
      pvVar6 = (value)value_create_float((float)dVar8);
      *v = pvVar6;
      return (uint)(pvVar6 == (value)0x0);
    }
    ppuVar5 = __ctype_b_loc();
    bVar1 = src[sVar7];
    bVar3 = bVar2;
    if (((*ppuVar5)[(char)bVar1] >> 0xb & 1) == 0) {
      uVar4 = bVar1 - 0x2b;
      if (0x3b < uVar4) {
        return 1;
      }
      if ((0x800000004000005U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
        if ((ulong)uVar4 != 3) {
          return 1;
        }
        goto LAB_00102d28;
      }
    }
    else if (bVar1 == 0x2e) {
LAB_00102d28:
      bVar3 = true;
      if (bVar2) {
        return 1;
      }
    }
    bVar2 = bVar3;
    sVar7 = sVar7 + 1;
  } while( true );
}

Assistant:

int metacall_serial_impl_deserialize_float(value *v, const char *src, size_t length)
{
	size_t iterator, is_digit;

	/* TODO: Improve parser */
	for (is_digit = 0, iterator = 0; iterator < length; ++iterator)
	{
		if (isdigit((int)src[iterator]) == 0 &&
			src[iterator] != '.' &&
			src[iterator] != '-' &&
			src[iterator] != '+' &&
			src[iterator] != 'E' &&
			src[iterator] != 'f')
		{
			return 1;
		}

		if (src[iterator] == '.')
		{
			if (is_digit == 1)
			{
				return 1;
			}

			is_digit = 1;
		}
	}

	/* TODO: Warning possible information lost in casting */
	*v = value_create_float((float)atof(src));

	return (*v == NULL);
}